

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodejoin.cc
# Opt level: O0

RC __thiscall QL_NodeJoin::OpenIt(QL_NodeJoin *this)

{
  int iVar1;
  int local_1c;
  RC rc;
  QL_NodeJoin *this_local;
  
  if ((this->useIndexJoin & 1U) == 0) {
    local_1c = (**this->node1->_vptr_QL_Node)();
    if ((local_1c != 0) || (local_1c = (**this->node2->_vptr_QL_Node)(), local_1c != 0)) {
      return local_1c;
    }
  }
  else {
    iVar1 = (**this->node1->_vptr_QL_Node)();
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  this->gotFirstTuple = false;
  return 0;
}

Assistant:

RC QL_NodeJoin::OpenIt(){
  RC rc = 0;
  if(!useIndexJoin){
    if((rc = node1.OpenIt()) || (rc = node2.OpenIt()))
      return (rc);
  }
  else{
    if((rc = node1.OpenIt() ))
      return (rc);
  }
  gotFirstTuple = false;
 
  return (0);
}